

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O2

TRef lj_ir_tonum(jit_State *J,TRef tr)

{
  TRef TVar1;
  undefined4 uVar2;
  
  if ((tr & 0x1f000000) == 0xe000000) {
    return tr;
  }
  if ((tr >> 0x18 & 0x1f) - 0xf < 5) {
    uVar2 = 0x550e01d3;
  }
  else {
    if ((tr & 0x1f000000) != 0x4000000) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    uVar2 = 0x588e0000;
  }
  (J->fold).ins.field_0.op1 = (IRRef1)tr;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = uVar2;
  TVar1 = lj_opt_fold(J);
  return TVar1;
}

Assistant:

TRef LJ_FASTCALL lj_ir_tonum(jit_State *J, TRef tr)
{
  if (!tref_isnum(tr)) {
    if (tref_isinteger(tr))
      tr = emitir(IRTN(IR_CONV), tr, IRCONV_NUM_INT);
    else if (tref_isstr(tr))
      tr = emitir(IRTG(IR_STRTO, IRT_NUM), tr, 0);
    else
      lj_trace_err(J, LJ_TRERR_BADTYPE);
  }
  return tr;
}